

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

CURLcode Curl_http2_request_upgrade(dynbuf *req,Curl_easy *data)

{
  connectdata *pcVar1;
  uint uVar2;
  CURLcode CVar3;
  size_t insize;
  char *base64;
  size_t blen;
  char *local_40;
  size_t local_38;
  
  pcVar1 = data->conn;
  (pcVar1->proto).ftpc.cwdcount = 3;
  uVar2 = Curl_multi_max_concurrent_streams(data->multi);
  (pcVar1->proto).httpc.local_settings[0].value = uVar2;
  (pcVar1->proto).ftpc.newhost = (char *)0x200000000000004;
  (pcVar1->proto).httpc.local_settings[2].settings_id = 2;
  *(uint *)((long)&pcVar1->proto + 0xbc) = (uint)(data->multi->push_cb != (curl_push_callback)0x0);
  (pcVar1->proto).httpc.local_settings_num = 3;
  insize = nghttp2_pack_settings_payload
                     ((uint8_t *)&pcVar1->proto,0x50,(pcVar1->proto).httpc.local_settings,3);
  if ((long)insize < 1) {
    Curl_failf(data,"nghttp2 unexpectedly failed on pack_settings_payload");
    Curl_dyn_free(req);
    CVar3 = CURLE_FAILED_INIT;
  }
  else {
    (pcVar1->proto).httpc.binlen = insize;
    CVar3 = Curl_base64url_encode((char *)&pcVar1->proto,insize,&local_40,&local_38);
    if (CVar3 == CURLE_OK) {
      CVar3 = Curl_dyn_addf(req,
                            "Connection: Upgrade, HTTP2-Settings\r\nUpgrade: %s\r\nHTTP2-Settings: %s\r\n"
                            ,"h2c",local_40);
      (*Curl_cfree)(local_40);
      (data->req).upgr101 = UPGR101_H2;
    }
    else {
      Curl_dyn_free(req);
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_http2_request_upgrade(struct dynbuf *req,
                                    struct Curl_easy *data)
{
  CURLcode result;
  ssize_t binlen;
  char *base64;
  size_t blen;
  struct connectdata *conn = data->conn;
  struct SingleRequest *k = &data->req;
  uint8_t *binsettings = conn->proto.httpc.binsettings;
  struct http_conn *httpc = &conn->proto.httpc;

  populate_settings(data, httpc);

  /* this returns number of bytes it wrote */
  binlen = nghttp2_pack_settings_payload(binsettings, H2_BINSETTINGS_LEN,
                                         httpc->local_settings,
                                         httpc->local_settings_num);
  if(binlen <= 0) {
    failf(data, "nghttp2 unexpectedly failed on pack_settings_payload");
    Curl_dyn_free(req);
    return CURLE_FAILED_INIT;
  }
  conn->proto.httpc.binlen = binlen;

  result = Curl_base64url_encode((const char *)binsettings, binlen,
                                 &base64, &blen);
  if(result) {
    Curl_dyn_free(req);
    return result;
  }

  result = Curl_dyn_addf(req,
                         "Connection: Upgrade, HTTP2-Settings\r\n"
                         "Upgrade: %s\r\n"
                         "HTTP2-Settings: %s\r\n",
                         NGHTTP2_CLEARTEXT_PROTO_VERSION_ID, base64);
  free(base64);

  k->upgr101 = UPGR101_H2;

  return result;
}